

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevel2DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,Vec2 *coord,int coordZ,UVec4 *result)

{
  uint uVar1;
  uint uVar2;
  int c;
  bool bVar3;
  int ndx;
  int iVar4;
  int z;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_8c;
  undefined4 local_7c;
  int local_78;
  undefined4 local_74;
  undefined4 local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  tcu local_50 [16];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(access->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar8 = floorf(local_38);
  fVar9 = floorf(local_34);
  fVar10 = floorf(local_40);
  local_8c = (int)fVar10;
  fVar10 = floorf(local_3c);
  local_6c = (int)fVar10;
  bVar3 = local_8c <= local_6c;
  if (local_8c <= local_6c) {
    local_78 = (int)fVar8;
    bVar3 = true;
    c = local_78;
    do {
      for (; c <= (int)fVar9; c = c + 1) {
        iVar4 = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
        z = TexVerifierUtil::wrap(sampler->wrapT,local_8c,(access->m_size).m_data[1]);
        if ((((iVar4 < 0) || ((access->m_size).m_data[0] <= iVar4)) || (z < 0)) ||
           ((((access->m_size).m_data[1] <= z || (coordZ < 0)) ||
            ((access->m_size).m_data[2] <= coordZ)))) {
          sampleTextureBorder<unsigned_int>(local_50,&access->m_format,sampler);
        }
        else {
          ConstPixelBufferAccess::getPixelT<unsigned_int>
                    ((ConstPixelBufferAccess *)local_50,(int)access,iVar4,z);
        }
        local_68 = 0;
        uStack_60 = 0;
        lVar5 = 0;
        do {
          uVar1 = result->m_data[lVar5];
          uVar2 = *(uint *)(local_50 + lVar5 * 4);
          iVar4 = uVar1 - uVar2;
          if (uVar1 < uVar2) {
            iVar4 = -(uVar1 - uVar2);
          }
          *(int *)((long)&local_68 + lVar5 * 4) = iVar4;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_70 = 0;
        lVar5 = 0;
        do {
          *(bool *)((long)&local_70 + lVar5) =
               *(uint *)((long)&local_68 + lVar5 * 4) <= (prec->colorThreshold).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_74 = 0;
        lVar5 = 0;
        do {
          *(byte *)((long)&local_74 + lVar5) = (prec->colorMask).m_data[lVar5] ^ 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_7c = 0;
        lVar5 = 0;
        do {
          *(byte *)((long)&local_7c + lVar5) =
               *(byte *)((long)&local_74 + lVar5) | *(byte *)((long)&local_70 + lVar5);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        if ((char)local_7c != '\0') {
          uVar6 = 0xffffffffffffffff;
          do {
            if (uVar6 == 2) {
              uVar7 = 3;
              break;
            }
            uVar7 = uVar6 + 1;
            lVar5 = uVar6 + 2;
            uVar6 = uVar7;
          } while (*(char *)((long)&local_7c + lVar5) != '\0');
          if (2 < uVar7) {
            return bVar3;
          }
        }
      }
      local_8c = local_8c + 1;
      bVar3 = local_8c <= local_6c;
      c = local_78;
    } while (local_8c <= local_6c);
  }
  return bVar3;
}

Assistant:

bool isLevel2DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const Vec2&					coord,
								 const int						coordZ,
								 const UVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coord, coordZ, result);
}